

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unredacted_debug_format_for_test_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ca77ac::UnredactedDebugFormatAPITest_MessageUnredactedDebugFormat_Test::
~UnredactedDebugFormatAPITest_MessageUnredactedDebugFormat_Test
          (UnredactedDebugFormatAPITest_MessageUnredactedDebugFormat_Test *this)

{
  UnredactedDebugFormatAPITest_MessageUnredactedDebugFormat_Test *this_local;
  
  ~UnredactedDebugFormatAPITest_MessageUnredactedDebugFormat_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(UnredactedDebugFormatAPITest, MessageUnredactedDebugFormat) {
  proto2_unittest::RedactedFields proto;
  proto2_unittest::TestNestedMessageRedaction redacted_nested_proto;
  proto2_unittest::TestNestedMessageRedaction unredacted_nested_proto;
  redacted_nested_proto.set_optional_unredacted_nested_string(
      "\350\260\267\346\255\214");
  unredacted_nested_proto.set_optional_unredacted_nested_string(
      "\350\260\267\346\255\214");
  *proto.mutable_optional_redacted_message() = redacted_nested_proto;
  *proto.mutable_optional_unredacted_message() = unredacted_nested_proto;

  EXPECT_THAT(UnredactedDebugFormatForTest(proto),
              StrEq("optional_redacted_message {\n  "
                    "optional_unredacted_nested_string: "
                    "\"\\350\\260\\267\\346\\255\\214\"\n}\n"
                    "optional_unredacted_message {\n  "
                    "optional_unredacted_nested_string: "
                    "\"\\350\\260\\267\\346\\255\\214\"\n}\n"));
}